

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O1

void gl4cts::EnhancedLayouts::debug_proc
               (GLenum source,GLenum type,GLuint id,GLenum severity,GLsizei param_5,GLchar *message,
               void *info)

{
  size_t sVar1;
  char *__s;
  char *__s_00;
  char *__s_01;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  undefined8 auStack_198 [12];
  ios_base local_138 [264];
  
  __s_01 = "Unknown";
  __s_00 = "Unknown";
  if (source - 0x8246 < 6) {
    __s_00 = &DAT_01a4c930 + *(int *)(&DAT_01a4c930 + (ulong)(source - 0x8246) * 4);
  }
  if ((int)type < 0x8268) {
    __s = "Unknown";
    switch(type) {
    case 0x824c:
      __s = "ERROR";
      break;
    case 0x824d:
      __s = "DEPRECATED_BEHAVIOR";
      break;
    case 0x824e:
      __s = "UNDEFINED_BEHAVIOR";
      break;
    case 0x824f:
      __s = "PORTABILITY";
      break;
    case 0x8250:
      __s = "PERFORMANCE";
      break;
    case 0x8251:
      __s = "OTHER";
    }
  }
  else if (type == 0x8268) {
    __s = "MARKER";
  }
  else if (type == 0x8269) {
    __s = "PUSH_GROUP";
  }
  else {
    __s = "Unknown";
    if (type == 0x826a) {
      __s = "POP_GROUP";
    }
  }
  if ((int)severity < 0x9147) {
    if (severity == 0x826b) {
      __s_01 = "N";
    }
    else if (severity == 0x9146) {
      __s_01 = "H";
    }
  }
  else if (severity == 0x9147) {
    __s_01 = "M";
  }
  else if (severity == 0x9148) {
    __s_01 = "L";
  }
  local_1b0 = *(undefined1 (*) [8])(*info + 0x10);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"DEBUG_INFO: ",0xc);
  *(undefined8 *)((long)auStack_198 + (long)local_1a8[-3]) = 3;
  sVar1 = strlen(__s_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,__s_00,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"|",1);
  sVar1 = strlen(__s_01);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,__s_01,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"|",1);
  *(undefined8 *)((long)auStack_198 + (long)local_1a8[-3]) = 0x12;
  sVar1 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,__s,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"|",1);
  *(undefined8 *)((long)auStack_198 + (long)local_1a8[-3]) = 0xc;
  std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,": ",2);
  if (message == (GLchar *)0x0) {
    std::ios::clear((int)(ostringstream *)&local_1a8 + (int)local_1a8[-3]);
  }
  else {
    sVar1 = strlen(message);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,message,sVar1);
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void GLW_APIENTRY debug_proc(GLenum source, GLenum type, GLuint id, GLenum severity, GLsizei /* length */,
							 const GLchar* message, void* info)
{
	deqp::Context* ctx = (deqp::Context*)info;

	const GLchar* source_str   = "Unknown";
	const GLchar* type_str	 = "Unknown";
	const GLchar* severity_str = "Unknown";

	switch (source)
	{
	case GL_DEBUG_SOURCE_API:
		source_str = "API";
		break;
	case GL_DEBUG_SOURCE_APPLICATION:
		source_str = "APP";
		break;
	case GL_DEBUG_SOURCE_OTHER:
		source_str = "OTR";
		break;
	case GL_DEBUG_SOURCE_SHADER_COMPILER:
		source_str = "COM";
		break;
	case GL_DEBUG_SOURCE_THIRD_PARTY:
		source_str = "3RD";
		break;
	case GL_DEBUG_SOURCE_WINDOW_SYSTEM:
		source_str = "WS";
		break;
	default:
		break;
	}

	switch (type)
	{
	case GL_DEBUG_TYPE_DEPRECATED_BEHAVIOR:
		type_str = "DEPRECATED_BEHAVIOR";
		break;
	case GL_DEBUG_TYPE_ERROR:
		type_str = "ERROR";
		break;
	case GL_DEBUG_TYPE_MARKER:
		type_str = "MARKER";
		break;
	case GL_DEBUG_TYPE_OTHER:
		type_str = "OTHER";
		break;
	case GL_DEBUG_TYPE_PERFORMANCE:
		type_str = "PERFORMANCE";
		break;
	case GL_DEBUG_TYPE_POP_GROUP:
		type_str = "POP_GROUP";
		break;
	case GL_DEBUG_TYPE_PORTABILITY:
		type_str = "PORTABILITY";
		break;
	case GL_DEBUG_TYPE_PUSH_GROUP:
		type_str = "PUSH_GROUP";
		break;
	case GL_DEBUG_TYPE_UNDEFINED_BEHAVIOR:
		type_str = "UNDEFINED_BEHAVIOR";
		break;
	default:
		break;
	}

	switch (severity)
	{
	case GL_DEBUG_SEVERITY_HIGH:
		severity_str = "H";
		break;
	case GL_DEBUG_SEVERITY_LOW:
		severity_str = "L";
		break;
	case GL_DEBUG_SEVERITY_MEDIUM:
		severity_str = "M";
		break;
	case GL_DEBUG_SEVERITY_NOTIFICATION:
		severity_str = "N";
		break;
	default:
		break;
	}

	ctx->getTestContext().getLog() << tcu::TestLog::Message << "DEBUG_INFO: " << std::setw(3) << source_str << "|"
								   << severity_str << "|" << std::setw(18) << type_str << "|" << std::setw(12) << id
								   << ": " << message << tcu::TestLog::EndMessage;
}